

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_PlayerThink(player_t *player)

{
  ticcmd_t *ptVar1;
  ActorFlags *pAVar2;
  byte *pbVar3;
  ActorFlags2 *pAVar4;
  float fVar5;
  double dVar6;
  char cVar7;
  short sVar8;
  APlayerPawn *pAVar9;
  sector_t *psVar10;
  float fVar11;
  int iVar12;
  undefined1 *puVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  Node *pNVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *pAVar22;
  short sVar23;
  Node *pNVar24;
  short sVar25;
  uint uVar26;
  int iVar27;
  AActor *pAVar28;
  char *musicname;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  double dVar32;
  double dVar33;
  float fVar34;
  FName local_50;
  FName local_4c;
  FSoundID local_48;
  FSoundID local_44;
  FName local_40;
  FSoundID local_3c;
  DAngle local_38;
  DAngle local_30;
  
  if (player->mo == (APlayerPawn *)0x0) {
    I_Error("No player %td start\n");
  }
  if ((debugfile != (FILE *)0x0) && ((player->cheats & 0x2000) == 0)) {
    pAVar9 = player->mo;
    fprintf((FILE *)debugfile,"tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n"
            ,(pAVar9->super_AActor).__Pos.X,(pAVar9->super_AActor).__Pos.Y,
            (pAVar9->super_AActor).__Pos.Z,(pAVar9->super_AActor).Angles.Yaw.Degrees,
            (ulong)(uint)gametic,
            (ulong)(uint)((int)((ulong)&player[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3d),
            (ulong)(player->cmd).ucmd.buttons,(ulong)(uint)(int)(player->cmd).ucmd.pitch,
            (ulong)(uint)(int)(player->cmd).ucmd.yaw,
            (ulong)(uint)(int)(player->cmd).ucmd.forwardmove,
            (ulong)(uint)(int)(player->cmd).ucmd.sidemove,
            (ulong)(uint)(int)(player->cmd).ucmd.upmove);
  }
  fVar31 = player->DesiredFOV;
  if ((player->playerstate != '\x01') && (player->ReadyWeapon != (AWeapon *)0x0)) {
    fVar5 = player->ReadyWeapon->FOVScale;
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      fVar31 = fVar31 * ABS(fVar5);
    }
  }
  fVar5 = player->FOV;
  if ((fVar5 != fVar31) || (NAN(fVar5) || NAN(fVar31))) {
    if (7.0 <= ABS(fVar5 - fVar31)) {
      fVar34 = ABS(fVar5 - fVar31) * 0.025;
      fVar11 = 7.0;
      if (7.0 <= fVar34) {
        fVar11 = fVar34;
      }
      fVar31 = (float)(-(uint)(fVar31 < fVar5) & (uint)-fVar11 |
                      ~-(uint)(fVar31 < fVar5) & (uint)fVar11) + fVar5;
    }
    player->FOV = fVar31;
  }
  if (player->inventorytics != 0) {
    player->inventorytics = player->inventorytics + -1;
  }
  uVar26 = 0xffffbfff;
  if ((player->cheats & 0x40000001U) == 0x40000000) {
    uVar26 = 0xbfffbffe;
  }
  uVar26 = uVar26 & player->cheats;
  player->cheats = uVar26;
  if ((uVar26 & 0x40000001) == 0) {
    pAVar9 = player->mo;
    if ((pAVar9->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar20 = (**(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar9);
      (pAVar9->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar20);
    }
    if ((((pAVar9->super_AActor).super_DThinker.super_DObject.Class)->Defaults[0x1bd] & 0x10) != 0)
    goto LAB_0046b5d0;
    pAVar2 = &(player->mo->super_AActor).flags;
    pAVar2->Value = pAVar2->Value & 0xffffefff;
  }
  else {
LAB_0046b5d0:
    pAVar2 = &(player->mo->super_AActor).flags;
    pAVar2->Value = pAVar2->Value | 0x1000;
  }
  pAVar9 = player->mo;
  if ((player->cheats & 0x40000000) == 0) {
    if (((pAVar9->super_AActor).flags2.Value & 0x10) == 0) {
      if ((pAVar9->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar20 = (**(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar9);
        (pAVar9->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_00,iVar20);
      }
      if ((((pAVar9->super_AActor).super_DThinker.super_DObject.Class)->Defaults[0x1bd] & 2) == 0) {
        pAVar2 = &(player->mo->super_AActor).flags;
        pAVar2->Value = pAVar2->Value & 0xfffffdff;
      }
    }
  }
  else {
    pbVar3 = (byte *)((long)&(pAVar9->super_AActor).flags.Value + 1);
    *pbVar3 = *pbVar3 | 2;
  }
  player->original_oldbuttons = (player->original_cmd).buttons;
  sVar8 = (player->cmd).ucmd.pitch;
  sVar23 = (player->cmd).ucmd.yaw;
  sVar25 = (player->cmd).ucmd.roll;
  sVar14 = (player->cmd).ucmd.forwardmove;
  sVar15 = (player->cmd).ucmd.sidemove;
  sVar16 = (player->cmd).ucmd.upmove;
  (player->original_cmd).buttons = (player->cmd).ucmd.buttons;
  (player->original_cmd).pitch = sVar8;
  (player->original_cmd).yaw = sVar23;
  (player->original_cmd).roll = sVar25;
  (player->original_cmd).forwardmove = sVar14;
  (player->original_cmd).sidemove = sVar15;
  (player->original_cmd).upmove = sVar16;
  pAVar9 = player->mo;
  uVar26 = (pAVar9->super_AActor).flags.Value;
  if ((char)uVar26 < '\0') {
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.forwardmove = 0x6400;
    (player->cmd).ucmd.sidemove = 0;
    (pAVar9->super_AActor).flags.Value = uVar26 & 0xffffff7f;
  }
  bVar19 = true;
  if ((gamestate != GS_TITLELEVEL) && ((player->cheats & 0x1000) == 0)) {
    if (((byte)level.flags2 & 0x20) == 0) {
      bVar19 = false;
    }
    else {
      bVar19 = player->timefreezer == 0;
    }
  }
  ptVar1 = &player->cmd;
  if (bVar19) {
    uVar26 = 0;
    if (gamestate != GS_TITLELEVEL) {
      uVar26 = (ptVar1->ucmd).buttons & 2;
    }
    (player->cmd).ucmd.buttons = uVar26;
    player->turnticks = '\0';
    (player->cmd).ucmd.pitch = 0;
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.roll = 0;
    (player->cmd).ucmd.forwardmove = 0;
    (player->cmd).ucmd.sidemove = 0;
    (player->cmd).ucmd.upmove = 0;
  }
  else if ((player->cheats & 0x40) != 0) {
    (player->cmd).ucmd.forwardmove = 0;
    (player->cmd).ucmd.sidemove = 0;
    (player->cmd).ucmd.upmove = 0;
  }
  uVar26 = (ptVar1->ucmd).buttons;
  if ((uVar26 & 4) != 0) {
    (ptVar1->ucmd).buttons = uVar26 & 0xfffffff7;
  }
  if ((((player->morphTics == 0) || ((pAVar9->PlayerFlags & 4) != 0)) && (0 < player->health)) &&
     (bVar18 = FLevelLocals::IsCrouchingAllowed(&level), bVar18)) {
    if (!bVar19) {
      uVar21 = (uint)player->crouching;
      uVar26 = (player->cmd).ucmd.buttons;
      if (player->crouching == '\0') {
        uVar21 = -(uint)((uVar26 >> 3 & 1) != 0) | 1;
      }
      else if ((uVar26 & 8) != 0) {
        player->crouching = '\0';
      }
      if (uVar21 == 0xffffffff) {
        if (0.5 < player->crouchfactor) {
          iVar20 = -1;
          goto LAB_0046b915;
        }
      }
      else if (((uVar21 == 1) && (player->crouchfactor <= 1.0 && player->crouchfactor != 1.0)) &&
              (pAVar9 = player->mo,
              (pAVar9->super_AActor).__Pos.Z + (pAVar9->super_AActor).Height <
              (pAVar9->super_AActor).ceilingz)) {
        iVar20 = 1;
LAB_0046b915:
        P_CrouchMove(player,iVar20);
      }
    }
  }
  else if ((player->crouchfactor != 1.0) || (NAN(player->crouchfactor))) {
    player->crouchfactor = 1.0;
    player->crouching = '\0';
    player->crouchdir = '\0';
    player->crouchoffset = 0.0;
    player->crouchviewdelta = 0.0;
    player->viewheight = player->mo->ViewHeight;
  }
  player->crouchoffset = (1.0 - player->crouchfactor) * -player->mo->ViewHeight;
  cVar7 = player->MUSINFOtics;
  if ((cVar7 < '\0') || (pAVar28 = (player->MUSINFOactor).field_0.p, pAVar28 == (AActor *)0x0))
  goto LAB_0046b984;
  if (((pAVar28->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (player->MUSINFOactor).field_0.p = (AActor *)0x0;
    goto LAB_0046b984;
  }
  player->MUSINFOtics = cVar7 + -1;
  if (cVar7 != '\0') goto LAB_0046b984;
  uVar29 = ((long)&player[-0x91ab].ConversationNPCAngle >> 5) * -0x30c30c30c30c30c3;
  if (uVar29 - (long)consoleplayer == 0) {
    if (((player->MUSINFOactor).field_0.p)->args[0] == 0) {
      musicname = "*";
      iVar20 = 0;
    }
    else {
      uVar26 = ((player->MUSINFOactor).field_0.p)->args[0];
      pNVar17 = ((level.info)->MusicMap).Nodes + (((level.info)->MusicMap).Size - 1 & uVar26);
      do {
        pNVar24 = pNVar17;
        if ((pNVar24 == (Node *)0x0) || (pNVar24->Next == (Node *)0x1)) {
          pNVar24 = (Node *)0x0;
          break;
        }
        pNVar17 = pNVar24->Next;
      } while ((pNVar24->Pair).Key != uVar26);
      if (pNVar24 == (Node *)0x0) goto LAB_0046b961;
      musicname = FName::NameData.NameArray[(pNVar24->Pair).Value.Index].Text;
      iVar20 = ((player->MUSINFOactor).field_0.p)->args[1];
    }
    S_ChangeMusic(musicname,iVar20,true,false);
  }
LAB_0046b961:
  DPrintf(3,"MUSINFO change for player %d to %d\n",uVar29 & 0xffffffff,
          (ulong)(uint)((player->MUSINFOactor).field_0.p)->args[0]);
LAB_0046b984:
  if (player->playerstate == '\x01') {
    if ((player->crouchfactor != 1.0) || (NAN(player->crouchfactor))) {
      player->crouchfactor = 1.0;
      player->crouching = '\0';
      player->crouchdir = '\0';
      player->crouchoffset = 0.0;
      player->crouchviewdelta = 0.0;
      player->viewheight = player->mo->ViewHeight;
    }
    P_DeathThink(player);
    return;
  }
  iVar20 = player->jumpTics;
  if (iVar20 != 0) {
    iVar27 = 0;
    if (player->onground == false) {
      iVar27 = iVar20 + -1;
    }
    if (-0x12 < iVar20) {
      iVar27 = iVar20 + -1;
    }
    player->jumpTics = iVar27;
  }
  if ((player->morphTics != 0) && ((player->cheats & 0x2000) == 0)) {
    APlayerPawn::MorphPlayerThink(player->mo);
  }
  bVar19 = FLevelLocals::IsFreelookAllowed(&level);
  if (bVar19) {
    sVar8 = (player->cmd).ucmd.pitch;
    if (sVar8 != 0) {
      if (sVar8 == -0x8000) {
        player->centering = true;
      }
      else if (player->centering == false) {
        dVar32 = (double)(int)sVar8 * -0.0054931640625 +
                 (player->mo->super_AActor).Angles.Pitch.Degrees;
        dVar33 = (player->MinPitch).Degrees;
        dVar6 = (player->MaxPitch).Degrees;
        uVar29 = -(ulong)(dVar6 <= dVar32);
        uVar30 = -(ulong)(dVar33 < dVar32);
        (player->mo->super_AActor).Angles.Pitch.Degrees =
             (double)(~uVar30 & (ulong)dVar33 |
                     (uVar29 & (ulong)dVar6 | ~uVar29 & (ulong)dVar32) & uVar30);
      }
    }
  }
  else {
    (player->mo->super_AActor).Angles.Pitch.Degrees = 0.0;
  }
  if (player->centering == true) {
    pAVar9 = player->mo;
    dVar33 = (pAVar9->super_AActor).Angles.Pitch.Degrees;
    if (ABS(dVar33) <= 2.0) {
      (pAVar9->super_AActor).Angles.Pitch.Degrees = 0.0;
      player->centering = false;
      if (((long)&player[-0x91ab].ConversationNPCAngle >> 5) * -0x30c30c30c30c30c3 -
          (long)consoleplayer == 0) {
        LocalViewPitch = 0;
      }
    }
    else {
      (pAVar9->super_AActor).Angles.Pitch.Degrees = dVar33 * 0.6666666666666666;
    }
  }
  if ((((ptVar1->ucmd).buttons & 0x10) != 0) && ((player->oldbuttons & 0x10) == 0)) {
    player->turnticks = '\t';
  }
  iVar20 = (player->mo->super_AActor).reactiontime;
  if (iVar20 == 0) {
    P_MovePlayer(player);
    if (((player->cmd).ucmd.buttons & 4) != 0) {
      dVar33 = player->crouchoffset;
      if ((dVar33 != 0.0) || (NAN(dVar33))) {
        player->crouching = '\x01';
      }
      else {
        pAVar9 = player->mo;
        if ((pAVar9->super_AActor).waterlevel < 2) {
          if (((pAVar9->super_AActor).flags.Value & 0x200) == 0) {
            bVar19 = FLevelLocals::IsJumpingAllowed(&level);
            if (((bVar19) && (player->onground == true)) && (player->jumpTics == 0)) {
              pAVar9 = player->mo;
              dVar33 = (pAVar9->JumpZ * 35.0) / 35.0;
              uVar26 = player->cheats;
              if ((uVar26 >> 0x12 & 1) != 0) {
                dVar33 = dVar33 + dVar33;
              }
              (pAVar9->super_AActor).Vel.Z = dVar33 + (pAVar9->super_AActor).Vel.Z;
              puVar13 = (undefined1 *)((long)&(pAVar9->super_AActor).flags2.Value + 1);
              *puVar13 = *puVar13 & 0xf7;
              player->jumpTics = -1;
              if ((uVar26 >> 0xd & 1) == 0) {
                local_3c.ID = S_FindSound("*jump");
                S_Sound(&pAVar9->super_AActor,4,&local_3c,1.0,1.0);
              }
            }
          }
          else {
            (pAVar9->super_AActor).Vel.Z = 3.0;
          }
        }
        else {
          (pAVar9->super_AActor).Vel.Z = (pAVar9->super_AActor).Speed * 4.0;
        }
      }
    }
    sVar8 = (player->cmd).ucmd.upmove;
    if (sVar8 != 0) {
      if (sVar8 == -0x8000) {
        pAVar9 = player->mo;
        uVar26 = (pAVar9->super_AActor).flags.Value;
        if (((uVar26 >> 9 & 1) != 0) && ((pAVar9->super_AActor).waterlevel < 2)) {
          (pAVar9->super_AActor).flags.Value = uVar26 & 0xfffffdff;
        }
      }
      else {
        sVar23 = sVar8;
        if (0x2ff < sVar8) {
          sVar23 = 0x300;
        }
        sVar25 = -0x300;
        if (-0x300 < sVar23) {
          sVar25 = sVar23;
        }
        (player->cmd).ucmd.upmove = sVar25;
        pAVar9 = player->mo;
        iVar20 = (pAVar9->super_AActor).waterlevel;
        if (((iVar20 < 2) && (((pAVar9->super_AActor).flags2.Value & 0x10) == 0)) &&
           (((uint)player->cheats >> 0x1e & 1) == 0)) {
          if (((uint)player->cheats >> 0xd & 1) == 0 && 0 < sVar8) {
            local_40.Index = 0x61;
            pAVar22 = AActor::FindInventory(&pAVar9->super_AActor,&local_40);
            if (pAVar22 != (AInventory *)0x0) {
              (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])();
            }
          }
        }
        else {
          dVar33 = (double)(int)sVar25 * (pAVar9->super_AActor).Speed * 0.0078125;
          (pAVar9->super_AActor).Vel.Z = dVar33;
          if ((iVar20 < 2) && (uVar26 = (pAVar9->super_AActor).flags.Value, (uVar26 >> 9 & 1) == 0))
          {
            pAVar4 = &(pAVar9->super_AActor).flags2;
            *(byte *)&pAVar4->Value = (byte)pAVar4->Value | 0x10;
            (pAVar9->super_AActor).flags.Value = uVar26 | 0x200;
            if ((dVar33 <= -39.0) && ((player->cheats & 0x2000) == 0)) {
              S_StopSound(&pAVar9->super_AActor,2);
            }
          }
        }
      }
    }
  }
  else {
    (player->mo->super_AActor).reactiontime = iVar20 + -1;
  }
  P_CalcHeight(player);
  if ((player->cheats & 0x2000) == 0) {
    P_PlayerOnSpecial3DFloor(player);
    P_PlayerInSpecialSector(player,(sector_t *)0x0);
    pAVar9 = player->mo;
    psVar10 = (pAVar9->super_AActor).Sector;
    if (((pAVar9->super_AActor).__Pos.Z <=
         ((psVar10->floorplane).normal.Y * (pAVar9->super_AActor).__Pos.Y +
         (psVar10->floorplane).normal.X * (pAVar9->super_AActor).__Pos.X + (psVar10->floorplane).D)
         * (psVar10->floorplane).negiC + 1.52587890625e-05) ||
       ((pAVar9->super_AActor).waterlevel != 0)) {
      iVar20 = P_GetThingFloorType(&pAVar9->super_AActor);
      P_PlayerOnSpecialFlat(player,iVar20);
    }
    pAVar9 = player->mo;
    dVar33 = (pAVar9->super_AActor).Vel.Z;
    if ((((dVar33 <= -pAVar9->FallingScreamMinSpeed) && (-pAVar9->FallingScreamMaxSpeed <= dVar33))
        && (player->morphTics == 0)) && ((pAVar9->super_AActor).waterlevel == 0)) {
      local_44.ID = S_FindSound("*falling");
      iVar20 = S_FindSkinnedSound(&pAVar9->super_AActor,&local_44);
      if ((iVar20 != 0) &&
         (bVar19 = S_IsActorPlayingSomething(&player->mo->super_AActor,2,iVar20), !bVar19)) {
        local_48.ID = iVar20;
        S_Sound(&player->mo->super_AActor,2,&local_48,1.0,1.0);
      }
    }
    if (((player->cmd).ucmd.buttons & 2) == 0) {
      player->usedown = false;
    }
    else if (player->usedown == false) {
      player->usedown = true;
      bVar19 = P_TalkFacing(&player->mo->super_AActor);
      if (!bVar19) {
        P_UseLines(player);
      }
    }
    if (player->morphTics != 0) {
      if (player->chickenPeck != 0) {
        player->chickenPeck = player->chickenPeck + -3;
      }
      iVar20 = player->morphTics + -1;
      player->morphTics = iVar20;
      if (iVar20 == 0) {
        P_UndoPlayerMorph(player,player,0x1000,false);
      }
    }
    player_t::TickPSprites(player);
    if (player->damagecount != 0) {
      player->damagecount = player->damagecount + -1;
    }
    if (player->bonuscount != 0) {
      player->bonuscount = player->bonuscount + -1;
    }
    iVar20 = player->hazardcount;
    if (iVar20 != 0) {
      player->hazardcount = iVar20 + -1;
      if ((0x231 < iVar20) && (level.time % player->hazardinterval == 0)) {
        local_4c.Index = (player->hazardtype).Index;
        local_30.Degrees = 0.0;
        P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,5,&local_4c,0,&local_30);
      }
    }
    iVar20 = player->poisoncount;
    if ((iVar20 != 0) && ((level.time & 0xfU) == 0)) {
      iVar27 = 0;
      if (4 < iVar20) {
        iVar27 = iVar20 + -5;
      }
      player->poisoncount = iVar27;
      pAVar28 = (player->poisoner).field_0.p;
      if ((pAVar28 != (AActor *)0x0) &&
         (((pAVar28->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (player->poisoner).field_0.p = (AActor *)0x0;
        pAVar28 = (AActor *)0x0;
      }
      P_PoisonDamage(player,pAVar28,1,true);
    }
    if (((byte)dmflags2.Value & 0x80) != 0) {
      pAVar9 = player->mo;
      iVar20 = pAVar9->MaxHealth;
      if ((pAVar9->MaxHealth < 1) && (iVar20 = 100, (i_compatflags._1_1_ & 0x10) == 0)) {
        iVar20 = deh.MaxHealth;
      }
      if (level.time * -0x75075075 + 0x3a83a83U < 0x7507507) {
        iVar20 = iVar20 + (pAVar9->super_AActor).stamina;
        iVar27 = player->health;
        if (iVar20 < iVar27) {
          iVar12 = iVar27 + -1;
          if (iVar27 + -5 < iVar20) {
            iVar12 = iVar20;
          }
          player->health = iVar12;
          (pAVar9->super_AActor).health = iVar12;
        }
      }
    }
    pAVar9 = player->mo;
    if ((((pAVar9->super_AActor).waterlevel < 3) ||
        (((pAVar9->super_AActor).flags2.Value & 0x8000000) != 0)) ||
       ((player->cheats & 0x42000002U) != 0)) {
      APlayerPawn::ResetAirSupply(pAVar9,true);
    }
    else if ((level.time & 0x1fU) == 0 && player->air_finished <= level.time) {
      local_50.Index = 0xbf;
      local_38.Degrees = 0.0;
      P_DamageMobj(&pAVar9->super_AActor,(AActor *)0x0,(AActor *)0x0,
                   (level.time - player->air_finished) / 0x23 + 2,&local_50,0,&local_38);
    }
  }
  return;
}

Assistant:

void P_PlayerThink (player_t *player)
{
	ticcmd_t *cmd;

	if (player->mo == NULL)
	{
		I_Error ("No player %td start\n", player - players + 1);
	}

	if (debugfile && !(player->cheats & CF_PREDICTING))
	{
		fprintf (debugfile, "tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n",
			gametic, (int)(player-players), player->mo->X(), player->mo->Y(), player->mo->Z(),
			player->mo->Angles.Yaw.Degrees, player->cmd.ucmd.buttons,
			player->cmd.ucmd.pitch, player->cmd.ucmd.yaw, player->cmd.ucmd.forwardmove,
			player->cmd.ucmd.sidemove, player->cmd.ucmd.upmove);
	}

	// [RH] Zoom the player's FOV
	float desired = player->DesiredFOV;
	// Adjust FOV using on the currently held weapon.
	if (player->playerstate != PST_DEAD &&		// No adjustment while dead.
		player->ReadyWeapon != NULL &&			// No adjustment if no weapon.
		player->ReadyWeapon->FOVScale != 0)		// No adjustment if the adjustment is zero.
	{
		// A negative scale is used to prevent G_AddViewAngle/G_AddViewPitch
		// from scaling with the FOV scale.
		desired *= fabsf(player->ReadyWeapon->FOVScale);
	}
	if (player->FOV != desired)
	{
		if (fabsf (player->FOV - desired) < 7.f)
		{
			player->FOV = desired;
		}
		else
		{
			float zoom = MAX(7.f, fabsf(player->FOV - desired) * 0.025f);
			if (player->FOV > desired)
			{
				player->FOV = player->FOV - zoom;
			}
			else
			{
				player->FOV = player->FOV + zoom;
			}
		}
	}
	if (player->inventorytics)
	{
		player->inventorytics--;
	}
	// Don't interpolate the view for more than one tic
	player->cheats &= ~CF_INTERPVIEW;

	// No-clip cheat
	if ((player->cheats & (CF_NOCLIP | CF_NOCLIP2)) == CF_NOCLIP2)
	{ // No noclip2 without noclip
		player->cheats &= ~CF_NOCLIP2;
	}
	if (player->cheats & (CF_NOCLIP | CF_NOCLIP2) || (player->mo->GetDefault()->flags & MF_NOCLIP))
	{
		player->mo->flags |= MF_NOCLIP;
	}
	else
	{
		player->mo->flags &= ~MF_NOCLIP;
	}
	if (player->cheats & CF_NOCLIP2)
	{
		player->mo->flags |= MF_NOGRAVITY;
	}
	else if (!(player->mo->flags2 & MF2_FLY) && !(player->mo->GetDefault()->flags & MF_NOGRAVITY))
	{
		player->mo->flags &= ~MF_NOGRAVITY;
	}
	cmd = &player->cmd;

	// Make unmodified copies for ACS's GetPlayerInput.
	player->original_oldbuttons = player->original_cmd.buttons;
	player->original_cmd = cmd->ucmd;

	if (player->mo->flags & MF_JUSTATTACKED)
	{ // Chainsaw/Gauntlets attack auto forward motion
		cmd->ucmd.yaw = 0;
		cmd->ucmd.forwardmove = 0xc800/2;
		cmd->ucmd.sidemove = 0;
		player->mo->flags &= ~MF_JUSTATTACKED;
	}

	bool totallyfrozen = P_IsPlayerTotallyFrozen(player);

	// [RH] Being totally frozen zeros out most input parameters.
	if (totallyfrozen)
	{
		if (gamestate == GS_TITLELEVEL)
		{
			cmd->ucmd.buttons = 0;
		}
		else
		{
			cmd->ucmd.buttons &= BT_USE;
		}
		cmd->ucmd.pitch = 0;
		cmd->ucmd.yaw = 0;
		cmd->ucmd.roll = 0;
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
		player->turnticks = 0;
	}
	else if (player->cheats & CF_FROZEN)
	{
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
	}

	// Handle crouching
	if (player->cmd.ucmd.buttons & BT_JUMP)
	{
		player->cmd.ucmd.buttons &= ~BT_CROUCH;
	}
	if (player->CanCrouch() && player->health > 0 && level.IsCrouchingAllowed())
	{
		if (!totallyfrozen)
		{
			int crouchdir = player->crouching;
		
			if (crouchdir == 0)
			{
				crouchdir = (player->cmd.ucmd.buttons & BT_CROUCH) ? -1 : 1;
			}
			else if (player->cmd.ucmd.buttons & BT_CROUCH)
			{
				player->crouching = 0;
			}
			if (crouchdir == 1 && player->crouchfactor < 1 &&
				player->mo->Top() < player->mo->ceilingz)
			{
				P_CrouchMove(player, 1);
			}
			else if (crouchdir == -1 && player->crouchfactor > 0.5)
			{
				P_CrouchMove(player, -1);
			}
		}
	}
	else
	{
		player->Uncrouch();
	}

	player->crouchoffset = -(player->mo->ViewHeight) * (1 - player->crouchfactor);

	// MUSINFO stuff
	if (player->MUSINFOtics >= 0 && player->MUSINFOactor != NULL)
	{
		if (--player->MUSINFOtics < 0)
		{
			if (player - players == consoleplayer)
			{
				if (player->MUSINFOactor->args[0] != 0)
				{
					FName *music = level.info->MusicMap.CheckKey(player->MUSINFOactor->args[0]);

					if (music != NULL)
					{
						S_ChangeMusic(music->GetChars(), player->MUSINFOactor->args[1]);
					}
				}
				else
				{
					S_ChangeMusic("*");
				}
			}
			DPrintf(DMSG_NOTIFY, "MUSINFO change for player %d to %d\n", (int)(player - players), player->MUSINFOactor->args[0]);
		}
	}

	if (player->playerstate == PST_DEAD)
	{
		player->Uncrouch();
		P_DeathThink (player);
		return;
	}
	if (player->jumpTics != 0)
	{
		player->jumpTics--;
		if (player->onground && player->jumpTics < -18)
		{
			player->jumpTics = 0;
		}
	}
	if (player->morphTics && !(player->cheats & CF_PREDICTING))
	{
		player->mo->MorphPlayerThink ();
	}

	// [RH] Look up/down stuff
	if (!level.IsFreelookAllowed())
	{
		player->mo->Angles.Pitch = 0.;
	}
	else
	{
		// The player's view pitch is clamped between -32 and +56 degrees,
		// which translates to about half a screen height up and (more than)
		// one full screen height down from straight ahead when view panning
		// is used.
		int clook = cmd->ucmd.pitch;
		if (clook != 0)
		{
			if (clook == -32768)
			{ // center view
				player->centering = true;
			}
			else if (!player->centering)
			{
				// no more overflows with floating point. Yay! :)
				player->mo->Angles.Pitch = clamp(player->mo->Angles.Pitch - clook * (360. / 65536.), player->MinPitch, player->MaxPitch);
			}
		}
	}
	if (player->centering)
	{
		if (fabs(player->mo->Angles.Pitch) > 2.)
		{
			player->mo->Angles.Pitch *= (2. / 3.);
		}
		else
		{
			player->mo->Angles.Pitch = 0.;
			player->centering = false;
			if (player - players == consoleplayer)
			{
				LocalViewPitch = 0;
			}
		}
	}

	// [RH] Check for fast turn around
	if (cmd->ucmd.buttons & BT_TURN180 && !(player->oldbuttons & BT_TURN180))
	{
		player->turnticks = TURN180_TICKS;
	}

	// Handle movement
	if (player->mo->reactiontime)
	{ // Player is frozen
		player->mo->reactiontime--;
	}
	else
	{
		P_MovePlayer (player);

		// [RH] check for jump
		if (cmd->ucmd.buttons & BT_JUMP)
		{
			if (player->crouchoffset != 0)
			{
				// Jumping while crouching will force an un-crouch but not jump
				player->crouching = 1;
			}
			else if (player->mo->waterlevel >= 2)
			{
				player->mo->Vel.Z = 4 * player->mo->Speed;
			}
			else if (player->mo->flags & MF_NOGRAVITY)
			{
				player->mo->Vel.Z = 3.;
			}
			else if (level.IsJumpingAllowed() && player->onground && player->jumpTics == 0)
			{
				double jumpvelz = player->mo->JumpZ * 35 / TICRATE;

				// [BC] If the player has the high jump power, double his jump velocity.
				if ( player->cheats & CF_HIGHJUMP )	jumpvelz *= 2;

				player->mo->Vel.Z += jumpvelz;
				player->mo->flags2 &= ~MF2_ONMOBJ;
				player->jumpTics = -1;
				if (!(player->cheats & CF_PREDICTING))
					S_Sound(player->mo, CHAN_BODY, "*jump", 1, ATTN_NORM);
			}
		}

		if (cmd->ucmd.upmove == -32768)
		{ // Only land if in the air
			if ((player->mo->flags & MF_NOGRAVITY) && player->mo->waterlevel < 2)
			{
				//player->mo->flags2 &= ~MF2_FLY;
				player->mo->flags &= ~MF_NOGRAVITY;
			}
		}
		else if (cmd->ucmd.upmove != 0)
		{
			// Clamp the speed to some reasonable maximum.
			cmd->ucmd.upmove = clamp<short>(cmd->ucmd.upmove, -0x300, 0x300);
			if (player->mo->waterlevel >= 2 || (player->mo->flags2 & MF2_FLY) || (player->cheats & CF_NOCLIP2))
			{
				player->mo->Vel.Z = player->mo->Speed * cmd->ucmd.upmove / 128.;
				if (player->mo->waterlevel < 2 && !(player->mo->flags & MF_NOGRAVITY))
				{
					player->mo->flags2 |= MF2_FLY;
					player->mo->flags |= MF_NOGRAVITY;
					if ((player->mo->Vel.Z <= -39) && !(player->cheats & CF_PREDICTING))
					{ // Stop falling scream
						S_StopSound (player->mo, CHAN_VOICE);
					}
				}
			}
			else if (cmd->ucmd.upmove > 0 && !(player->cheats & CF_PREDICTING))
			{
				AInventory *fly = player->mo->FindInventory (NAME_ArtiFly);
				if (fly != NULL)
				{
					player->mo->UseInventory (fly);
				}
			}
		}
	}

	P_CalcHeight (player);

	if (!(player->cheats & CF_PREDICTING))
	{
		P_PlayerOnSpecial3DFloor (player);
		P_PlayerInSpecialSector (player);

		if (!player->mo->isAbove(player->mo->Sector->floorplane.ZatPoint(player->mo)) ||
			player->mo->waterlevel)
		{
			// Player must be touching the floor
			P_PlayerOnSpecialFlat(player, P_GetThingFloorType(player->mo));
		}
		if (player->mo->Vel.Z <= -player->mo->FallingScreamMinSpeed &&
			player->mo->Vel.Z >= -player->mo->FallingScreamMaxSpeed && !player->morphTics &&
			player->mo->waterlevel == 0)
		{
			int id = S_FindSkinnedSound (player->mo, "*falling");
			if (id != 0 && !S_IsActorPlayingSomething (player->mo, CHAN_VOICE, id))
			{
				S_Sound (player->mo, CHAN_VOICE, id, 1, ATTN_NORM);
			}
		}
		// check for use
		if (cmd->ucmd.buttons & BT_USE)
		{
			if (!player->usedown)
			{
				player->usedown = true;
				if (!P_TalkFacing(player->mo))
				{
					P_UseLines(player);
				}
			}
		}
		else
		{
			player->usedown = false;
		}
		// Morph counter
		if (player->morphTics)
		{
			if (player->chickenPeck)
			{ // Chicken attack counter
				player->chickenPeck -= 3;
			}
			if (!--player->morphTics)
			{ // Attempt to undo the chicken/pig
				P_UndoPlayerMorph (player, player, MORPH_UNDOBYTIMEOUT);
			}
		}
		// Cycle psprites
		player->TickPSprites();

		// Other Counters
		if (player->damagecount)
			player->damagecount--;

		if (player->bonuscount)
			player->bonuscount--;

		if (player->hazardcount)
		{
			player->hazardcount--;
			if (!(level.time % player->hazardinterval) && player->hazardcount > 16*TICRATE)
				P_DamageMobj (player->mo, NULL, NULL, 5, player->hazardtype);
		}

		if (player->poisoncount && !(level.time & 15))
		{
			player->poisoncount -= 5;
			if (player->poisoncount < 0)
			{
				player->poisoncount = 0;
			}
			P_PoisonDamage (player, player->poisoner, 1, true);
		}

		// Apply degeneration.
		if (dmflags2 & DF2_YES_DEGENERATION)
		{
			int maxhealth = player->mo->GetMaxHealth() + player->mo->stamina;
			if ((level.time % TICRATE) == 0 && player->health > maxhealth)
			{
				if (player->health - 5 < maxhealth)
					player->health = maxhealth;
				else
					player->health--;

				player->mo->health = player->health;
			}
		}

		// Handle air supply
		//if (level.airsupply > 0)
		{
			if (player->mo->waterlevel < 3 ||
				(player->mo->flags2 & MF2_INVULNERABLE) ||
				(player->cheats & (CF_GODMODE | CF_NOCLIP2)) ||
				(player->cheats & CF_GODMODE2))
			{
				player->mo->ResetAirSupply ();
			}
			else if (player->air_finished <= level.time && !(level.time & 31))
			{
				P_DamageMobj (player->mo, NULL, NULL, 2 + ((level.time-player->air_finished)/TICRATE), NAME_Drowning);
			}
		}
	}
}